

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O1

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildSpirVAsmTask,_8U> *this,deUintptr newSize)

{
  deUintptr val_1;
  undefined8 *puVar1;
  void **ppvVar2;
  void **ppvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  deUintptr ndx;
  ulong uVar8;
  ulong uVar9;
  deUintptr val;
  ulong uVar10;
  bool bVar11;
  
  uVar8 = this->m_numElements;
  if (newSize < uVar8) {
    uVar8 = newSize;
    if (newSize < this->m_numElements) {
      do {
        puVar1 = (undefined8 *)
                 ((ulong)(((uint)uVar8 & 0xf) * 0x30) + (long)this->m_pageTable[uVar8 >> 4]);
        *puVar1 = &PTR_execute_00d1ad40;
        if ((long *)puVar1[1] != puVar1 + 3) {
          operator_delete((long *)puVar1[1],puVar1[3] + 1);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < this->m_numElements);
    }
    this->m_numElements = newSize;
  }
  else if (uVar8 < newSize) {
    if (this->m_capacity <= newSize) {
      uVar9 = newSize + 0xf >> 4;
      uVar6 = 0;
      ppvVar2 = (void **)0x0;
      if (this->m_pageTableCapacity < uVar9) {
        uVar10 = this->m_pageTableCapacity * 2;
        if (uVar10 <= uVar9) {
          uVar10 = uVar9;
        }
        ppvVar3 = (void **)deMemPool_alloc(this->m_pool->m_pool,(long)(uVar10 << 0x23) >> 0x20);
        if (ppvVar3 == (void **)0x0) {
LAB_00389531:
          puVar1 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar1 = time;
          __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar6 = this->m_pageTableCapacity;
        if (uVar6 == 0) {
          uVar5 = 0;
        }
        else {
          uVar4 = 0;
          do {
            ppvVar3[uVar4] = this->m_pageTable[uVar4];
            uVar4 = uVar4 + 1;
            uVar5 = uVar6;
          } while (uVar6 != uVar4);
        }
        if (uVar5 < uVar10) {
          memset(ppvVar3 + uVar6,0,(uVar10 - uVar6) * 8);
        }
        ppvVar2 = this->m_pageTable;
        uVar6 = uVar6 << 3;
        this->m_pageTable = ppvVar3;
        this->m_pageTableCapacity = uVar10;
      }
      uVar10 = this->m_capacity >> 4;
      while( true ) {
        pvVar7 = (void *)((long)ppvVar2 + 7U & 0xfffffffffffffff8);
        uVar5 = (long)pvVar7 + (0x300 - (long)ppvVar2);
        bVar11 = uVar6 < uVar5;
        uVar6 = uVar6 - uVar5;
        if (bVar11) break;
        this->m_pageTable[uVar10] = pvVar7;
        uVar10 = uVar10 + 1;
        ppvVar2 = (void **)((long)pvVar7 + 0x300);
      }
      if (uVar10 < uVar9) {
        do {
          pvVar7 = deMemPool_alignedAlloc(this->m_pool->m_pool,0x300,8);
          if (pvVar7 == (void *)0x0) goto LAB_00389531;
          this->m_pageTable[uVar10] = pvVar7;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      this->m_capacity = uVar10 << 4;
    }
    this->m_numElements = newSize;
    if (uVar8 < newSize) {
      do {
        puVar1 = (undefined8 *)
                 ((ulong)(((uint)uVar8 & 0xf) * 0x30) + (long)this->m_pageTable[uVar8 >> 4]);
        *puVar1 = &PTR_execute_00d1ad40;
        puVar1[1] = puVar1 + 3;
        puVar1[2] = 0;
        *(undefined1 *)(puVar1 + 3) = 0;
        puVar1[5] = 0;
        uVar8 = uVar8 + 1;
      } while (uVar8 < this->m_numElements);
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}